

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,uchar (*param_3) [3],
                         undefined8 param_4,CappedArray<char,_17UL> *param_5)

{
  CappedArray<char,_17UL> local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  char *local_40;
  undefined8 local_38;
  Array<kj::CappedArray<char,_5UL>_> local_30;
  
  local_50 = *param_2;
  uStack_48 = param_2[1];
  local_40 = ", ";
  local_38 = 3;
  local_30.ptr = (CappedArray<char,_5UL> *)0x0;
  local_30.size_ = 0;
  local_30.disposer = (ArrayDisposer *)0x0;
  toCharSequence<unsigned_char(&)[3]>(&local_70,(kj *)param_2[4],param_3);
  concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (__return_storage_ptr__,(_ *)&local_50,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)(param_2 + 5),(StringPtr *)&local_70,
             param_5);
  Array<kj::CappedArray<char,_5UL>_>::~Array(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}